

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InferenceEngine.cpp
# Opt level: O1

ClauseGenerationResult __thiscall
Inferences::CompositeSGI::generateSimplify(CompositeSGI *this,Clause *cl)

{
  long *plVar1;
  int *piVar2;
  long *plVar3;
  int iVar4;
  SplitSet *pSVar5;
  SplitSet *pSVar6;
  undefined8 *puVar7;
  IteratorCore<Kernel::Clause_*> *pIVar8;
  char cVar9;
  ClauseIterator CVar10;
  void **head;
  ulong uVar11;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 extraout_RDX_04;
  undefined8 extraout_RDX_05;
  undefined8 extraout_RDX_06;
  undefined8 uVar12;
  bool bVar13;
  unsigned_long *puVar14;
  VirtualIterator<Kernel::Clause_*> *pVVar15;
  uint *puVar16;
  undefined8 *puVar17;
  ClauseGenerationResult CVar18;
  ClauseGenerationResult res;
  Stack<Lib::VirtualIterator<Kernel::Clause_*>_> local_118;
  long *local_f0;
  long *local_e8;
  char local_e0;
  size_t local_d8;
  IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1781:65),_Lib::VirtualIterator<Kernel::Clause_*>_>_>
  *pIStack_d0;
  unsigned_long *local_c8;
  VirtualIterator<Kernel::Clause_*> *pVStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  long local_a8;
  Clause *local_98;
  ClauseIterator local_90;
  FlatteningIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1781:65),_Lib::VirtualIterator<Kernel::Clause_*>_>_>_>
  local_88;
  
  local_118._cursor = (VirtualIterator<Kernel::Clause_*> *)0x0;
  local_118._end = (VirtualIterator<Kernel::Clause_*> *)0x0;
  local_118._capacity = 0;
  local_118._stack = (VirtualIterator<Kernel::Clause_*> *)0x0;
  pSVar5 = (cl->super_Unit)._inference._splits;
  pSVar6 = (SplitSet *)(cl->super_Unit)._inference._ptr1;
  local_98 = cl;
  local_90._core = (IteratorCore<Kernel::Clause_*> *)this;
  if (pSVar5 == pSVar6) {
    bVar13 = false;
  }
  else {
    bVar13 = false;
    do {
      puVar16 = pSVar5->_items;
      (**(code **)(*(long *)pSVar5->_size + 0x28))(&local_e8);
      plVar1 = local_e8;
      if (local_e8 != (long *)0x0) {
        *(int *)(local_e8 + 1) = (int)local_e8[1] + 1;
      }
      if (local_118._cursor == local_118._end) {
        ::Lib::Stack<Lib::VirtualIterator<Kernel::Clause_*>_>::expand(&local_118);
      }
      *local_118._cursor = (VirtualIterator<Kernel::Clause_*>)plVar1;
      if (plVar1 == (long *)0x0) {
        local_118._cursor = local_118._cursor + 1;
      }
      else {
        iVar4 = (int)plVar1[1];
        *(int *)(plVar1 + 1) = iVar4 + 1;
        local_118._cursor = local_118._cursor + 1;
        *(int *)(plVar1 + 1) = iVar4;
        if (iVar4 == 0) {
          (**(code **)(*plVar1 + 8))(plVar1);
        }
      }
      cVar9 = local_e0;
      if (local_e0 != '\0') {
        bVar13 = true;
      }
      if (local_e8 != (long *)0x0) {
        plVar1 = local_e8 + 1;
        *(int *)plVar1 = (int)*plVar1 + -1;
        if ((int)*plVar1 == 0) {
          (**(code **)(*local_e8 + 8))();
        }
      }
    } while ((cVar9 == '\0') && (pSVar5 = (SplitSet *)puVar16, (SplitSet *)puVar16 != pSVar6));
  }
  if (!bVar13) {
    puVar17 = *(undefined8 **)&local_98->field_0x38;
    puVar7 = *(undefined8 **)&local_98->_weight;
    if (puVar17 != puVar7) {
      do {
        (**(code **)(*(long *)*puVar17 + 0x30))(&local_f0);
        if (local_118._cursor == local_118._end) {
          ::Lib::Stack<Lib::VirtualIterator<Kernel::Clause_*>_>::expand(&local_118);
        }
        *local_118._cursor = (VirtualIterator<Kernel::Clause_*>)local_f0;
        if (local_f0 != (long *)0x0) {
          *(int *)(local_f0 + 1) = (int)local_f0[1] + 1;
        }
        local_118._cursor = local_118._cursor + 1;
        if (local_f0 != (long *)0x0) {
          plVar1 = local_f0 + 1;
          *(int *)plVar1 = (int)*plVar1 + -1;
          if ((int)*plVar1 == 0) {
            (**(code **)(*local_f0 + 8))();
          }
        }
        puVar17 = puVar17 + 1;
      } while (puVar17 != puVar7);
    }
  }
  pVStack_c0 = local_118._end;
  local_c8 = (unsigned_long *)local_118._cursor;
  pIStack_d0 = (IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1781:65),_Lib::VirtualIterator<Kernel::Clause_*>_>_>
                *)local_118._stack;
  local_d8 = local_118._capacity;
  local_a8 = (long)local_118._cursor - (long)local_118._stack >> 3;
  local_b8 = 0;
  uStack_b0 = 0;
  local_118._capacity = 0;
  local_118._end = (VirtualIterator<Kernel::Clause_*> *)0x0;
  local_118._stack = (VirtualIterator<Kernel::Clause_*> *)0x0;
  local_118._cursor = (VirtualIterator<Kernel::Clause_*> *)0x0;
  ::Lib::
  getFlattenedIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,Lib::arrayIter<Lib::Stack<Lib::VirtualIterator<Kernel::Clause*>>,unsigned_long>(Lib::Stack<Lib::VirtualIterator<Kernel::Clause*>>&&,unsigned_long)::_lambda(auto:1)_1_,Lib::VirtualIterator<Kernel::Clause*>>>>
            (&local_88,(Lib *)&local_d8,pIStack_d0);
  CVar10._core = local_90._core;
  ::Lib::
  pvi<Lib::FlatteningIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,Lib::arrayIter<Lib::Stack<Lib::VirtualIterator<Kernel::Clause*>>,unsigned_long>(Lib::Stack<Lib::VirtualIterator<Kernel::Clause*>>&&,unsigned_long)::_lambda(auto:1)_1_,Lib::VirtualIterator<Kernel::Clause*>>>>>
            ((Lib *)local_90._core,&local_88);
  *(bool *)&(CVar10._core)->_refCnt = bVar13;
  uVar12 = extraout_RDX;
  pVVar15 = local_88._master._iter._func.a._cursor;
  if ((local_88._current.super_OptionBase<Lib::VirtualIterator<Kernel::Clause_*>_>._isSome == true)
     && (local_88._current.super_OptionBase<Lib::VirtualIterator<Kernel::Clause_*>_>._elem._elem !=
         (Value)0x0)) {
    plVar1 = (long *)((long)local_88._current.
                            super_OptionBase<Lib::VirtualIterator<Kernel::Clause_*>_>._elem._elem +
                     8);
    *(int *)plVar1 = *(int *)plVar1 + -1;
    if (*(int *)plVar1 == 0) {
      (**(code **)(*(long *)local_88._current.
                            super_OptionBase<Lib::VirtualIterator<Kernel::Clause_*>_>._elem._elem +
                  8))();
      uVar12 = extraout_RDX_00;
      pVVar15 = local_88._master._iter._func.a._cursor;
    }
  }
  for (; pVVar15 != local_88._master._iter._func.a._stack; pVVar15 = pVVar15 + -1) {
    pIVar8 = pVVar15[-1]._core;
    if (pIVar8 != (IteratorCore<Kernel::Clause_*> *)0x0) {
      piVar2 = &pIVar8->_refCnt;
      *piVar2 = *piVar2 + -1;
      if (*piVar2 == 0) {
        (*pIVar8->_vptr_IteratorCore[1])();
        uVar12 = extraout_RDX_01;
      }
    }
  }
  puVar14 = local_c8;
  if (local_88._master._iter._func.a._stack != (VirtualIterator<Kernel::Clause_*> *)0x0) {
    uVar11 = local_88._master._iter._func.a._capacity * 8 + 0xf & 0xfffffffffffffff0;
    if (uVar11 == 0) {
      (local_88._master._iter._func.a._stack)->_core =
           (IteratorCore<Kernel::Clause_*> *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = local_88._master._iter._func.a._stack;
    }
    else if (uVar11 < 0x11) {
      (local_88._master._iter._func.a._stack)->_core =
           (IteratorCore<Kernel::Clause_*> *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = local_88._master._iter._func.a._stack;
    }
    else if (uVar11 < 0x19) {
      (local_88._master._iter._func.a._stack)->_core =
           (IteratorCore<Kernel::Clause_*> *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = local_88._master._iter._func.a._stack;
    }
    else if (uVar11 < 0x21) {
      (local_88._master._iter._func.a._stack)->_core =
           (IteratorCore<Kernel::Clause_*> *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = local_88._master._iter._func.a._stack;
    }
    else if (uVar11 < 0x31) {
      (local_88._master._iter._func.a._stack)->_core =
           (IteratorCore<Kernel::Clause_*> *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = local_88._master._iter._func.a._stack;
    }
    else if (uVar11 < 0x41) {
      (local_88._master._iter._func.a._stack)->_core =
           (IteratorCore<Kernel::Clause_*> *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = local_88._master._iter._func.a._stack;
    }
    else {
      operator_delete(local_88._master._iter._func.a._stack,0x10);
      uVar12 = extraout_RDX_02;
      puVar14 = local_c8;
    }
  }
  for (; (IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1781:65),_Lib::VirtualIterator<Kernel::Clause_*>_>_>
          *)puVar14 != pIStack_d0; puVar14 = puVar14 + -1) {
    plVar1 = (long *)puVar14[-1];
    if (plVar1 != (long *)0x0) {
      plVar3 = plVar1 + 1;
      *(int *)plVar3 = (int)*plVar3 + -1;
      if ((int)*plVar3 == 0) {
        (**(code **)(*plVar1 + 8))();
        uVar12 = extraout_RDX_03;
      }
    }
  }
  pVVar15 = local_118._cursor;
  if (pIStack_d0 !=
      (IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1781:65),_Lib::VirtualIterator<Kernel::Clause_*>_>_>
       *)0x0) {
    uVar11 = local_d8 * 8 + 0xf & 0xfffffffffffffff0;
    if (uVar11 == 0) {
      (pIStack_d0->_iter)._func.a._capacity = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = pIStack_d0;
    }
    else if (uVar11 < 0x11) {
      (pIStack_d0->_iter)._func.a._capacity = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = pIStack_d0;
    }
    else if (uVar11 < 0x19) {
      (pIStack_d0->_iter)._func.a._capacity = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = pIStack_d0;
    }
    else if (uVar11 < 0x21) {
      (pIStack_d0->_iter)._func.a._capacity = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = pIStack_d0;
    }
    else if (uVar11 < 0x31) {
      (pIStack_d0->_iter)._func.a._capacity = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = pIStack_d0;
    }
    else if (uVar11 < 0x41) {
      (pIStack_d0->_iter)._func.a._capacity = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = pIStack_d0;
    }
    else {
      operator_delete(pIStack_d0,0x10);
      uVar12 = extraout_RDX_04;
      pVVar15 = local_118._cursor;
    }
  }
  for (; pVVar15 != local_118._stack; pVVar15 = pVVar15 + -1) {
    pIVar8 = pVVar15[-1]._core;
    if (pIVar8 != (IteratorCore<Kernel::Clause_*> *)0x0) {
      piVar2 = &pIVar8->_refCnt;
      *piVar2 = *piVar2 + -1;
      if (*piVar2 == 0) {
        (*pIVar8->_vptr_IteratorCore[1])();
        uVar12 = extraout_RDX_05;
      }
    }
  }
  if (local_118._stack != (VirtualIterator<Kernel::Clause_*> *)0x0) {
    uVar11 = local_118._capacity * 8 + 0xf & 0xfffffffffffffff0;
    if (uVar11 == 0) {
      (local_118._stack)->_core =
           (IteratorCore<Kernel::Clause_*> *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = local_118._stack;
    }
    else if (uVar11 < 0x11) {
      (local_118._stack)->_core =
           (IteratorCore<Kernel::Clause_*> *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = local_118._stack;
    }
    else if (uVar11 < 0x19) {
      (local_118._stack)->_core =
           (IteratorCore<Kernel::Clause_*> *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = local_118._stack;
    }
    else if (uVar11 < 0x21) {
      (local_118._stack)->_core =
           (IteratorCore<Kernel::Clause_*> *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = local_118._stack;
    }
    else if (uVar11 < 0x31) {
      (local_118._stack)->_core =
           (IteratorCore<Kernel::Clause_*> *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = local_118._stack;
    }
    else if (uVar11 < 0x41) {
      (local_118._stack)->_core =
           (IteratorCore<Kernel::Clause_*> *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = local_118._stack;
    }
    else {
      operator_delete(local_118._stack,0x10);
      uVar12 = extraout_RDX_06;
    }
  }
  CVar18._8_8_ = uVar12;
  CVar18.clauses._core = CVar10._core;
  return CVar18;
}

Assistant:

CompositeSGI::ClauseGenerationResult CompositeSGI::generateSimplify(Kernel::Clause* cl)
{
  auto redundant = false;
  Stack<ClauseIterator> clauses;
  /* apply generations as until a redundancy is discovered */
  for (auto simpl : _simplifiers) {
    auto res = simpl->generateSimplify(cl);
    clauses.push(res.clauses);
    if (res.premiseRedundant) {
      redundant = true;
      break;
    }
  }
  if (!redundant) {
    /* apply strictly generating rules if there hasn't been a redundancy */
    for (auto gen : _generators) {
      clauses.push(gen->generateClauses(cl));
    }
  }
  return ClauseGenerationResult {
    .clauses          = pvi(getFlattenedIterator(arrayIter(std::move(clauses)))),
    .premiseRedundant = redundant,
  };
}